

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  double *resolutions;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  char automatonState;
  long firstSequenceLength;
  ulong local_78;
  args_t args;
  Vector copy_count;
  
  argparse::args_t::args_t(&args,argc,argv);
  initAlphabets(args.data == protein,(char *)0x0,false);
  automatonState = '\0';
  Vector::Vector(&copy_count);
  Vector::appendValue(&copy_count,0);
  firstSequenceLength = 0;
  local_78 = (ulong)(args.data != dna) << 4 | 4;
  iVar5 = (int)local_78;
  lVar7 = 0;
  resolutions = (double *)0x0;
  do {
    iVar2 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,true,&copy_count,args.counts_in_name,1.0,false);
    lVar1 = firstSequenceLength;
    if ((char)iVar2 == '\x01') {
      iVar5 = 1;
      goto LAB_00103cd8;
    }
    bVar8 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar8) {
      uVar6 = firstSequenceLength * local_78;
      resolutions = (double *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
      if (0 < (long)uVar6) {
        memset(resolutions,0,lVar1 * (ulong)(uint)(iVar5 * 8));
      }
    }
    lVar1 = firstSequenceLength;
    if (args.data == protein) {
      lVar3 = Vector::value(&copy_count,0);
      handle_a_sequence_aa(&sequences,resolutions,lVar1,lVar3,args.ambig == skipover);
    }
    else {
      lVar3 = Vector::value(&copy_count,0);
      handle_a_sequence(&sequences,resolutions,lVar1,lVar3,args.ambig == skipover);
    }
    Vector::value(&copy_count,0);
  } while ((char)iVar2 == '\x02');
  if (args.quiet == false) {
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\"unique\" : ",0xc);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , \"total\" : ",0xd);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  exportJSON(args.output,firstSequenceLength,local_78,resolutions,args.data == protein);
  iVar5 = 0;
  if (resolutions != (double *)0x0) {
    operator_delete__(resolutions);
    iVar5 = 0;
  }
LAB_00103cd8:
  Vector::~Vector(&copy_count);
  argparse::args_t::~args_t(&args);
  return iVar5;
}

Assistant:

int main (int argc, const char * argv[]) {

    args_t args = args_t (argc, argv);
    initAlphabets(args.data == protein);

    char automatonState = 0,
         fasta_result = 2;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence
    
    double * freq_counts = NULL;
    Vector copy_count;
    copy_count.appendValue(0);

 
    long sequences_read = 0L,
         sequence_copies = 0L,
         firstSequenceLength = 0L,
         dim = (args.data == dna) ? 4L: 20L;
          
    while (fasta_result == 2) {
        
        fasta_result = readFASTA (args.input, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true, &copy_count, args.counts_in_name);
        if (fasta_result == 1) {
            return 1;
        }
        if (sequences_read == 0) {
            freq_counts = new double [dim*firstSequenceLength];
            for (long k = 0; k < dim*firstSequenceLength; k++) freq_counts [k] = 0.;
        }
        
        if (args.data == protein) 
          handle_a_sequence_aa (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        else
          handle_a_sequence (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        sequences_read ++;
        sequence_copies += copy_count.value(0);
        /*if (args.quiet == false && sequences_read % 1000 == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << sequences_read << " reads";
        }*/

    }
  
    if (args.quiet == false) {
      cerr << endl << "{\"unique\" : " << sequences_read << " , \"total\" : " << sequence_copies << "}" << endl;
    }
    
    /*if (args.quiet == false) {
      cerr << endl;
    }*/
    
    exportJSON (args.output, firstSequenceLength, dim, freq_counts, args.data == protein);
    if (freq_counts) delete [] freq_counts;
    
    return 0;

}